

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>
slang::ast::Expression::bindImplicitParam
          (DataTypeSyntax *typeSyntax,ExpressionSyntax *rhs,SourceRange assignmentRange,
          ASTContext *exprContext,ASTContext *typeContext,bitmask<slang::ast::ASTFlags> extraFlags)

{
  Compilation *compilation;
  bool bVar1;
  bitwidth_t width;
  bitwidth_t bVar2;
  Type *this;
  Expression *pEVar3;
  Type *type;
  Expression *extraout_RDX;
  Expression *extraout_RDX_00;
  _Head_base<0UL,_const_slang::ast::Expression_*,_false> _Var4;
  bitmask<slang::ast::IntegralFlags> bVar5;
  SourceRange assignmentRange_00;
  tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*> tVar6;
  SourceRange assignmentRange_01;
  bitmask<slang::ast::ASTFlags> in_stack_00000010;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  bitmask<slang::ast::AssignFlags> *in_stack_ffffffffffffffb0;
  
  compilation = ((typeContext->scope).ptr)->compilation;
  if (rhs[3].super_SyntaxNode.previewNode != (SyntaxNode *)0x0) {
    this = Compilation::getType
                     (compilation,(DataTypeSyntax *)rhs,(ASTContext *)extraFlags.m_bits,(Type *)0x0)
    ;
    assignmentRange_01.endLoc = (SourceLocation)typeContext;
    assignmentRange_01.startLoc = (SourceLocation)exprContext;
    pEVar3 = bindRValue((Expression *)this,(Type *)assignmentRange.startLoc,
                        (ExpressionSyntax *)assignmentRange.endLoc,assignmentRange_01,
                        (ASTContext *)in_stack_00000010.m_bits,in_stack_ffffffffffffffa8);
    _Var4._M_head_impl = extraout_RDX;
    goto LAB_003bb10e;
  }
  type = (Type *)create(compilation,(ExpressionSyntax *)assignmentRange.startLoc,typeContext,
                        in_stack_00000010,(Type *)0x0);
  this = (Type *)(type->super_Symbol).name._M_len;
  if (rhs[1].super_SyntaxNode.parent == (SyntaxNode *)0x0) {
    bVar1 = Type::isIntegral(this);
    if (bVar1) {
      bVar2 = Type::getBitWidth(this);
      bVar1 = isUnsizedInteger((Expression *)type);
      width = 0x20;
      if (0x20 < bVar2) {
        width = bVar2;
      }
      if (!bVar1) {
        width = bVar2;
      }
      bVar5 = Type::getIntegralFlags(this);
      goto LAB_003bb0e6;
    }
  }
  else {
    width = Type::getBitWidth(this);
    bVar1 = Type::isIntegral(this);
    if (bVar1) {
      bVar1 = isUnsizedInteger((Expression *)type);
      if (bVar1) goto LAB_003bb07d;
    }
    else {
LAB_003bb07d:
      width = 0x20;
    }
    bVar5.m_bits = (short)rhs[1].super_SyntaxNode.kind == LogicalEquivalenceExpression;
LAB_003bb0e6:
    this = Compilation::getType
                     (compilation,width,(bitmask<slang::ast::IntegralFlags>)(bVar5.m_bits | 2));
  }
  assignmentRange_00.endLoc = (SourceLocation)0x0;
  assignmentRange_00.startLoc = (SourceLocation)exprContext;
  pEVar3 = convertAssignment((Expression *)typeContext,(ASTContext *)this,type,
                             (Expression *)assignmentRange.endLoc,assignmentRange_00,
                             (Expression **)0x0,in_stack_ffffffffffffffb0);
  _Var4._M_head_impl = extraout_RDX_00;
LAB_003bb10e:
  *(Type **)&(typeSyntax->super_ExpressionSyntax).super_SyntaxNode = this;
  (typeSyntax->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pEVar3;
  tVar6.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Head_base<0UL,_const_slang::ast::Expression_*,_false>._M_head_impl = _Var4._M_head_impl;
  tVar6.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>.
  super__Tuple_impl<1UL,_const_slang::ast::Type_*>.
  super__Head_base<1UL,_const_slang::ast::Type_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Type_*,_false>)typeSyntax;
  return (tuple<const_slang::ast::Expression_*,_const_slang::ast::Type_*>)
         tVar6.super__Tuple_impl<0UL,_const_slang::ast::Expression_*,_const_slang::ast::Type_*>;
}

Assistant:

std::tuple<const Expression*, const Type*> Expression::bindImplicitParam(
    const DataTypeSyntax& typeSyntax, const ExpressionSyntax& rhs, SourceRange assignmentRange,
    const ASTContext& exprContext, const ASTContext& typeContext, bitmask<ASTFlags> extraFlags) {

    // Rules are described in [6.20.2].
    Compilation& comp = exprContext.getCompilation();
    auto& it = typeSyntax.as<ImplicitTypeSyntax>();
    if (!it.dimensions.empty()) {
        // If we have a range provided, the result is always an integral value
        // of the provided width -- getType() will do what we want here.
        auto lhsType = &comp.getType(typeSyntax, typeContext);
        return {&bindRValue(*lhsType, rhs, assignmentRange, exprContext, extraFlags), lhsType};
    }

    Expression& expr = create(comp, rhs, exprContext, extraFlags);
    const Type* lhsType = expr.type;
    if (it.signing) {
        // If signing is provided, the result is always integral but we infer the width.
        // If the type is non-integral or unsized, infer a width of 32.
        bitwidth_t bits = lhsType->getBitWidth();
        if (!lhsType->isIntegral() || expr.isUnsizedInteger())
            bits = 32;

        bitmask<IntegralFlags> flags = IntegralFlags::FourState;
        if (it.signing.kind == TokenKind::SignedKeyword)
            flags |= IntegralFlags::Signed;

        lhsType = &comp.getType(bits, flags);
    }
    else {
        // Neither range nor signing provided, so infer from the expression type.
        // If integral, infer using rules mentioned above. Otherwise just take the type.
        if (lhsType->isIntegral()) {
            bitwidth_t bits = lhsType->getBitWidth();
            if (expr.isUnsizedInteger())
                bits = std::max(bits, 32u);

            // Keep the signed flag but force four state.
            auto flags = lhsType->getIntegralFlags();
            flags |= IntegralFlags::FourState;

            lhsType = &comp.getType(bits, flags);
        }
    }

    return {&convertAssignment(exprContext, *lhsType, expr, assignmentRange), lhsType};
}